

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

Amount __thiscall
cfd::ConfidentialTransactionContext::CalculateSimpleFee
          (ConfidentialTransactionContext *this,bool append_feature_signed_size,
          bool append_signed_witness)

{
  uint32_t size;
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000031;
  Amount AVar4;
  
  size = (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
           [4])();
  uVar1 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[5])(this);
  if ((int)CONCAT71(in_register_00000031,append_feature_signed_size) != 0) {
    iVar2 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
              _vptr_AbstractTransaction[6])(this);
    uVar1 = core::ConfidentialTransaction::GetTxInCount(&this->super_ConfidentialTransaction);
    iVar3 = 0x1b0;
    if (append_signed_witness) {
      iVar3 = 0x6c;
    }
    size = size + iVar3 * uVar1;
    uVar1 = iVar2 + iVar3 * uVar1 + 3 >> 2;
  }
  AVar4 = FeeCalculator::CalculateFee(size,uVar1,1000);
  return AVar4;
}

Assistant:

Amount ConfidentialTransactionContext::CalculateSimpleFee(
    bool append_feature_signed_size, bool append_signed_witness) const {
  static constexpr uint32_t kP2wpkhWitnessSize = 72 + 33 + 3;

  uint32_t size = GetTotalSize();
  uint32_t vsize = GetVsize();
  uint32_t rate = FeeCalculator::kRelayMinimumFee;
  if (append_feature_signed_size) {
    uint32_t weight = GetWeight();
    uint32_t count = GetTxInCount();
    uint32_t add_size;
    add_size = kP2wpkhWitnessSize * count;
    if (!append_signed_witness) {
      // no segwit (x4)
      add_size *= 4;
    }
    size += add_size;
    weight += add_size;
    vsize = (weight + 3) / 4;  // wally_tx_vsize_from_weight
  }
  return FeeCalculator::CalculateFee(size, vsize, rate);
}